

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

bool __thiscall
spvc_resources_s::copy_resources
          (spvc_resources_s *this,SmallVector<spvc_reflected_builtin_resource,_8UL> *outputs,
          SmallVector<spirv_cross::BuiltInResource,_8UL> *inputs)

{
  long lVar1;
  BuiltInResource *i;
  BuiltInResource *pBVar2;
  spvc_reflected_builtin_resource local_48;
  
  pBVar2 = (inputs->super_VectorView<spirv_cross::BuiltInResource>).ptr;
  for (lVar1 = (inputs->super_VectorView<spirv_cross::BuiltInResource>).buffer_size * 0x38;
      lVar1 != 0; lVar1 = lVar1 + -0x38) {
    local_48.builtin = pBVar2->builtin;
    local_48.value_type_id = (pBVar2->value_type_id).id;
    local_48.resource.id = (pBVar2->resource).id.id;
    local_48.resource.type_id = (pBVar2->resource).type_id.id;
    local_48.resource.base_type_id = (pBVar2->resource).base_type_id.id;
    local_48.resource.name = spvc_context_s::allocate_name(this->context,&(pBVar2->resource).name);
    if (local_48.resource.name == (char *)0x0) break;
    spirv_cross::SmallVector<spvc_reflected_builtin_resource,_8UL>::push_back(outputs,&local_48);
    pBVar2 = pBVar2 + 1;
  }
  return lVar1 == 0;
}

Assistant:

bool spvc_resources_s::copy_resources(SmallVector<spvc_reflected_builtin_resource> &outputs,
                                      const SmallVector<BuiltInResource> &inputs)
{
	for (auto &i : inputs)
	{
		spvc_reflected_builtin_resource br;

		br.value_type_id = i.value_type_id;
		br.builtin = SpvBuiltIn(i.builtin);

		auto &r = br.resource;
		r.base_type_id = i.resource.base_type_id;
		r.type_id = i.resource.type_id;
		r.id = i.resource.id;
		r.name = context->allocate_name(i.resource.name);
		if (!r.name)
			return false;

		outputs.push_back(br);
	}

	return true;
}